

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O3

void UnitTest::CheckEqual<char,char>
               (TestResults *results,char *expected,char *actual,TestDetails *details)

{
  ostream *poVar1;
  char *failure;
  MemoryOutStream stream;
  char local_1c1;
  undefined1 local_1c0 [408];
  
  if (*expected != *actual) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Expected ",9);
    local_1c1 = *expected;
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,&local_1c1,1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," but was ",9);
    local_1c1 = *actual;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1c1,1);
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c0,&MemoryOutStream::VTT);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x90));
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}